

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O1

int VP8IteratorProgress(VP8EncIterator *it,int delta)

{
  WebPPicture *pic;
  int iVar1;
  
  if (delta != 0) {
    pic = it->enc_->pic_;
    if (pic->progress_hook != (WebPProgressHook)0x0) {
      iVar1 = it->count_down0_;
      if (iVar1 < 1) {
        iVar1 = it->percent0_;
      }
      else {
        iVar1 = ((iVar1 - it->count_down_) * delta) / iVar1 + it->percent0_;
      }
      iVar1 = WebPReportProgress(pic,iVar1,&it->enc_->percent_);
      return iVar1;
    }
  }
  return 1;
}

Assistant:

int VP8IteratorProgress(const VP8EncIterator* const it, int delta) {
  VP8Encoder* const enc = it->enc_;
  if (delta && enc->pic_->progress_hook != NULL) {
    const int done = it->count_down0_ - it->count_down_;
    const int percent = (it->count_down0_ <= 0)
                      ? it->percent0_
                      : it->percent0_ + delta * done / it->count_down0_;
    return WebPReportProgress(enc->pic_, percent, &enc->percent_);
  }
  return 1;
}